

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::releaseExclusivePublication(ClientConductor *this,int64_t registrationId)

{
  pointer pEVar1;
  pointer pEVar2;
  int iVar3;
  pointer pEVar4;
  long lVar5;
  iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pEVar1 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pEVar2 - (long)pEVar1 >> 4) * -0x71c71c71c71c71c7 >> 2;
  pEVar4 = pEVar1;
  if (0 < lVar5) {
    pEVar4 = pEVar1 + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __position._M_current = pEVar1 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_00140b18;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_00140b18;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_00140b18;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00140b18;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
  }
  lVar5 = ((long)pEVar2 - (long)pEVar4 >> 4) * -0x71c71c71c71c71c7;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __position._M_current = pEVar2;
      if ((lVar5 != 3) ||
         (__position._M_current = pEVar4, pEVar4->m_registrationId == registrationId))
      goto LAB_00140b18;
      pEVar4 = pEVar4 + 1;
    }
    __position._M_current = pEVar4;
    if (pEVar4->m_registrationId == registrationId) goto LAB_00140b18;
    pEVar4 = pEVar4 + 1;
  }
  __position._M_current = pEVar4;
  if (pEVar4->m_registrationId != registrationId) {
    __position._M_current = pEVar2;
  }
LAB_00140b18:
  if (__position._M_current != pEVar2) {
    DriverProxy::removePublication(this->m_driverProxy,registrationId);
    std::
    vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
    ::_M_erase(&this->m_exclusivePublications,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseExclusivePublication(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [registrationId](const ExclusivePublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it != m_exclusivePublications.end())
    {
        m_driverProxy.removePublication(registrationId);
        m_exclusivePublications.erase(it);
    }
}